

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O1

anm_archive_t * anm_create(char *spec,FILE *symbolfp,uint version)

{
  list_t *list;
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  thanm_instr_t *instr;
  undefined8 *puVar10;
  long *plVar11;
  undefined4 *puVar12;
  uint *buffer;
  char *pcVar13;
  bool bVar14;
  size_t sVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  FILE *pFVar23;
  int iVar24;
  FILE *pFVar25;
  anm_archive_t *paVar26;
  list_node_t *plVar27;
  uint16_t *data;
  anm_archive_t *extraout_RAX;
  FILE *pFVar28;
  ulong uVar29;
  void *pvVar30;
  size_t sVar31;
  size_t sVar32;
  long lVar33;
  undefined4 extraout_var;
  long *plVar34;
  uint uVar35;
  int extraout_EDX;
  list_node_t *plVar36;
  long *plVar37;
  list_node_t *plVar38;
  list_node_t *plVar39;
  long *plVar40;
  short *buffer_00;
  ulong unaff_RBP;
  int *piVar41;
  char *pcVar42;
  char *pcVar43;
  byte bVar44;
  uint uVar45;
  long lVar46;
  list_node_t *plVar47;
  ulong unaff_R15;
  size_t sVar48;
  stringref_t ref;
  char line [128];
  undefined8 uStack_250;
  long lStack_248;
  long lStack_240;
  undefined8 uStack_238;
  uint uStack_230;
  uint uStack_22c;
  size_t sStack_228;
  long *plStack_220;
  long *plStack_218;
  ulong uStack_210;
  ulong uStack_208;
  FILE *pFStack_200;
  FILE *pFStack_1f8;
  long *plStack_1f0;
  long lStack_1e8;
  ulong uStack_1e0;
  code *pcStack_1d8;
  char *pcStack_1c8;
  uint uStack_1bc;
  FILE *pFStack_1b8;
  FILE *pFStack_1b0;
  ulong uStack_1a8;
  long lStack_1a0;
  int iStack_194;
  ushort uStack_18e;
  ushort uStack_18a;
  char *pcStack_178;
  ulong uStack_170;
  FILE *pFStack_168;
  undefined1 local_e8 [80];
  list_t local_98;
  list_t local_88;
  path_state_t local_78;
  char local_60;
  FILE *local_40;
  uint local_38;
  
  pcVar42 = "r";
  pFVar25 = fopen(spec,"r");
  if (pFVar25 != (FILE *)0x0) {
    fgets(local_e8,0x80,pFVar25);
    fseek(pFVar25,0,0);
    ref.len = 6;
    ref.str = "ENTRY ";
    iVar24 = util_strcmp_ref(local_e8,ref);
    if (iVar24 == 0) {
      anm_create_cold_5();
    }
    else {
      local_e8._0_4_ = 0;
      local_e8._4_2_ = 0;
      local_e8._8_4_ = -1;
      local_e8._12_4_ = -1;
      local_e8._20_4_ = 0;
      local_e8._24_4_ = 0;
      local_e8._28_4_ = 0;
      list_init((list_t *)(local_e8 + 0x20));
      list_init((list_t *)(local_e8 + 0x40));
      list_init((list_t *)(local_e8 + 0x60));
      list_init((list_t *)(local_e8 + 0x50));
      local_e8._48_8_ = (anm_entry_t *)0x0;
      local_e8._56_8_ = (anm_script_t *)0x0;
      local_60 = '\0';
      local_40 = symbolfp;
      local_38 = version;
      path_init((path_state_t *)(local_e8 + 0x70),spec,argv0);
      thanm_yyin = (FILE *)pFVar25;
      iVar24 = thanm_yyparse((parser_state_t *)local_e8);
      if (iVar24 == 0 && local_e8._0_4_ == 0) {
        path_free((path_state_t *)(local_e8 + 0x70));
        paVar26 = (anm_archive_t *)util_malloc(0x30);
        list = &paVar26->names;
        paVar26->map = (uchar *)0x0;
        paVar26->map_size = 0;
        list_init(list);
        (paVar26->entries).head = (list_node_t *)local_e8._32_8_;
        (paVar26->entries).tail = (list_node_t *)local_e8._40_8_;
        plVar39 = (list_node_t *)&paVar26->entries;
        do {
          plVar39 = plVar39->next;
          if (plVar39 == (list_node_t *)0x0) {
            reg_free_user();
            plVar37 = (long *)(local_e8 + 0x50);
            while (plVar37 = (long *)*plVar37, plVar37 != (long *)0x0) {
              pvVar30 = (void *)plVar37[2];
              free(*(void **)((long)pvVar30 + 8));
              free(pvVar30);
            }
            list_free_nodes((list_t *)(local_e8 + 0x50));
            plVar37 = (long *)(local_e8 + 0x60);
            while (plVar37 = (long *)*plVar37, plVar37 != (long *)0x0) {
              pvVar30 = (void *)plVar37[2];
              free(*(void **)((long)pvVar30 + 8));
              free(pvVar30);
            }
            list_free_nodes((list_t *)(local_e8 + 0x60));
            plVar39 = (list_node_t *)(local_e8 + 0x40);
            while (plVar39 = plVar39->next, plVar39 != (list_node_t *)0x0) {
              puVar10 = (undefined8 *)plVar39->data;
              free((void *)*puVar10);
              thanm_param_free((thanm_param_t *)puVar10[1]);
            }
            list_free_nodes((list_t *)(local_e8 + 0x40));
            return paVar26;
          }
          pvVar30 = plVar39->data;
          plVar47 = (list_node_t *)list;
          do {
            plVar47 = plVar47->next;
            if (plVar47 == (list_node_t *)0x0) {
              list_append_new(list,*(void **)((long)pvVar30 + 0x10));
              goto LAB_0010fb3e;
            }
            pcVar42 = (char *)plVar47->data;
            pcVar43 = *(char **)((long)pvVar30 + 0x10);
            iVar24 = strcmp(pcVar43,pcVar42);
          } while (iVar24 != 0);
          free(pcVar43);
          *(char **)((long)pvVar30 + 0x10) = pcVar42;
LAB_0010fb3e:
          plVar37 = (long *)((long)pvVar30 + 0x48);
          while (plVar37 = (long *)*plVar37, plVar37 != (long *)0x0) {
            lVar33 = plVar37[2];
            plVar47 = (list_node_t *)(lVar33 + 0x30);
            plVar36 = (list_node_t *)(lVar33 + 0x10);
            while (plVar36 = plVar36->next, plVar36 != (list_node_t *)0x0) {
              instr = (thanm_instr_t *)plVar36->data;
              plVar38 = (list_node_t *)&instr->params;
              uVar45 = 8;
              plVar27 = plVar38;
              while (plVar27 = plVar27->next, plVar27 != (list_node_t *)0x0) {
                uVar45 = uVar45 + (uint)(*plVar27->data != 0x73) * 2 + 2;
              }
              data = (uint16_t *)util_malloc((ulong)uVar45);
              *data = instr->id;
              data[1] = (short)uVar45 - 8;
              data[2] = instr->time;
              data[3] = 0;
              lVar46 = 0;
              bVar44 = 0;
              while (plVar38 = plVar38->next, plVar38 != (list_node_t *)0x0) {
                piVar41 = (int *)plVar38->data;
                if (piVar41[1] != 0) {
                  data[3] = data[3] | (ushort)(1 << (bVar44 & 0x1f));
                }
                iVar24 = *piVar41;
                if (iVar24 < 0x6e) {
                  if (iVar24 == 0x4e) {
                    pcVar42 = *(char **)(*(long *)(piVar41 + 4) + 8);
                    plVar40 = (long *)(local_e8 + 0x60);
                    do {
                      plVar40 = (long *)*plVar40;
                      if (plVar40 == (long *)0x0) {
                        piVar41 = (int *)0x0;
                        break;
                      }
                      piVar41 = (int *)plVar40[2];
                      iVar24 = strcmp(*(char **)(piVar41 + 2),pcVar42);
                    } while (iVar24 != 0);
                    if (piVar41 != (int *)0x0) goto LAB_0010fdcd;
                    anm_create_cold_1();
                  }
                  else if ((iVar24 == 0x53) || (iVar24 == 0x66)) {
                    iVar24 = *(int *)(*(long *)(piVar41 + 4) + 8);
                    goto LAB_0010fdd5;
                  }
                }
                else {
                  switch(iVar24) {
                  case 0x6e:
                    pcVar42 = *(char **)(*(long *)(piVar41 + 4) + 8);
                    plVar40 = (long *)(local_e8 + 0x50);
                    do {
                      plVar40 = (long *)*plVar40;
                      if (plVar40 == (long *)0x0) {
                        piVar41 = (int *)0x0;
                        break;
                      }
                      piVar41 = (int *)plVar40[2];
                      iVar24 = strcmp(*(char **)(piVar41 + 2),pcVar42);
                    } while (iVar24 != 0);
                    if (piVar41 == (int *)0x0) {
                      anm_create_cold_2();
                    }
                    else {
LAB_0010fdcd:
                      iVar24 = *piVar41;
LAB_0010fdd5:
                      *(int *)((long)data + lVar46 + 8) = iVar24;
                      lVar46 = lVar46 + 4;
                    }
                    break;
                  case 0x6f:
                    pcVar42 = *(char **)(*(long *)(piVar41 + 4) + 8);
                    plVar27 = plVar47;
                    do {
                      plVar27 = plVar27->next;
                      if (plVar27 == (list_node_t *)0x0) {
                        piVar41 = (int *)0x0;
                        break;
                      }
                      piVar41 = (int *)plVar27->data;
                      iVar24 = strcmp(*(char **)(piVar41 + 2),pcVar42);
                    } while (iVar24 != 0);
                    if (piVar41 != (int *)0x0) goto LAB_0010fdcd;
                    anm_create_cold_4();
                    break;
                  case 0x73:
                    *(undefined2 *)((long)data + lVar46 + 8) =
                         *(undefined2 *)(*(long *)(piVar41 + 4) + 8);
                    lVar46 = lVar46 + 2;
                    break;
                  case 0x74:
                    pcVar42 = *(char **)(*(long *)(piVar41 + 4) + 8);
                    plVar27 = plVar47;
                    do {
                      plVar27 = plVar27->next;
                      if (plVar27 == (list_node_t *)0x0) {
                        pvVar30 = (void *)0x0;
                        break;
                      }
                      pvVar30 = plVar27->data;
                      iVar24 = strcmp(*(char **)((long)pvVar30 + 8),pcVar42);
                    } while (iVar24 != 0);
                    if (pvVar30 != (void *)0x0) {
                      iVar24 = (int)*(short *)((long)pvVar30 + 4);
                      goto LAB_0010fdd5;
                    }
                    anm_create_cold_3();
                  }
                }
                bVar44 = bVar44 + 1;
              }
              list_append_new((list_t *)(lVar33 + 0x20),data);
              thanm_instr_free(instr);
            }
            list_free_nodes((list_t *)(lVar33 + 0x10));
            plVar36 = plVar47;
            while (plVar36 = plVar36->next, plVar36 != (list_node_t *)0x0) {
              pvVar30 = plVar36->data;
              free(*(void **)((long)pvVar30 + 8));
              free(pvVar30);
            }
            list_free_nodes((list_t *)plVar47);
            plVar47 = (list_node_t *)(lVar33 + 0x40);
            while (plVar47 = plVar47->next, plVar47 != (list_node_t *)0x0) {
              puVar10 = (undefined8 *)plVar47->data;
              free((void *)*puVar10);
              free(puVar10);
            }
            list_free_nodes((list_t *)(lVar33 + 0x40));
          }
        } while( true );
      }
    }
    return (anm_archive_t *)0x0;
  }
  pcVar43 = spec;
  anm_create_cold_6();
  pFVar25 = (FILE *)((ulong)pcVar42 & 0xffffffff);
  plVar37 = (long *)(pcVar43 + 0x20);
  paVar26 = extraout_RAX;
  pcStack_178 = spec;
  uStack_170 = (ulong)version;
  pFStack_168 = symbolfp;
  do {
    do {
      plVar37 = (long *)*plVar37;
      if (plVar37 == (long *)0x0) {
        return paVar26;
      }
      plVar40 = (long *)plVar37[2];
      paVar26 = (anm_archive_t *)*plVar40;
    } while (*(short *)((long)&paVar26[1].map + 4) == 0);
    pcStack_1c8 = (char *)plVar40[4];
    if (pcStack_1c8 == (char *)0x0) {
      pcStack_1c8 = (char *)plVar40[2];
    }
    pcVar42 = "rb";
    pcStack_1d8 = (code *)0x10ffec;
    pFVar28 = fopen(pcStack_1c8,"rb");
    uVar45 = (uint)pFVar25;
    if (uVar45 == 0x13) {
      uStack_1bc = uVar45;
      if (pFVar28 == (FILE *)0x0) goto LAB_001102c2;
      pcStack_1d8 = (code *)0x110014;
      fseek(pFVar28,0,2);
      pcStack_1d8 = (code *)0x11001c;
      uVar29 = ftell(pFVar28);
      pcStack_1d8 = (code *)0x11002b;
      fseek(pFVar28,0,0);
      *(int *)(plVar40[1] + 0xc) = (int)uVar29;
      pFVar25 = (FILE *)(uVar29 & 0xffffffff);
      pcStack_1d8 = (code *)0x110041;
      uStack_1a8 = uVar29;
      pFStack_1b0 = (FILE *)malloc((size_t)pFVar25);
      pcStack_1d8 = (code *)0x11005e;
      pFStack_1b8 = pFVar25;
      fread(pFStack_1b0,1,(size_t)pFVar25,pFVar28);
      pFVar23 = pFStack_1b0;
      pcStack_1d8 = (code *)0x11006b;
      fclose(pFVar28);
      uVar45 = (uint)uStack_1a8;
      if (((uVar45 < 0x1c) || (*(long *)pFVar23 != 0xa1a0a0d474e5089)) ||
         (*(int *)((long)&pFVar23->_IO_read_ptr + 4) != 0x52444849)) {
        if ((10 < uVar45) &&
           (((pFVar23->_flags == -0x1f002701 &&
             (*(char *)((long)&pFVar23->_IO_read_ptr + 2) == '\0' &&
              *(int *)&pFVar23->field_0x6 == 0x4649464a)) ||
            ((10 < uVar45 &&
             ((pFVar23->_flags == -0x1e002701 &&
              (*(char *)((long)&pFVar23->_IO_read_ptr + 2) == '\0' &&
               *(int *)&pFVar23->field_0x6 == 0x66697845)))))))) {
          pFVar25 = (FILE *)((long)&pFStack_1b8->_flags + (long)&pFVar23->_flags);
          pFVar28 = pFVar23;
          do {
            pcStack_1d8 = (code *)0x110109;
            pvVar30 = memchr(pFVar28,0xff,(long)pFVar25 - (long)pFVar28);
            if ((pvVar30 == (void *)0x0) ||
               (pFVar28 = (FILE *)((long)pvVar30 + 1), pFVar28 == pFVar25)) goto LAB_0011012e;
          } while ((byte)((byte)pFVar28->_flags | 2) != 0xc2);
          pFVar25 = (FILE *)((long)pFVar25 - (long)pvVar30);
          if (pFVar25 < (FILE *)0x9) {
LAB_0011012e:
            bVar14 = false;
          }
          else {
            unaff_R15 = (ulong)(ushort)(*(ushort *)((long)pvVar30 + 7) << 8 |
                                       *(ushort *)((long)pvVar30 + 7) >> 8);
            unaff_RBP = (ulong)(ushort)(*(ushort *)((long)pvVar30 + 5) << 8 |
                                       *(ushort *)((long)pvVar30 + 5) >> 8);
            bVar14 = true;
          }
          if (bVar14) goto LAB_001101c6;
        }
        pcStack_1d8 = (code *)0x1102ae;
        pcVar42 = (char *)pFVar23;
        anm_defaults_cold_3();
        pFVar28 = pFVar23;
LAB_001102ae:
        pcStack_1d8 = (code *)0x1102b8;
        anm_defaults_cold_1();
        goto LAB_001102b8;
      }
      uVar1 = *(ushort *)((long)&pFVar23->_IO_read_end + 2);
      uVar2 = *(ushort *)((long)&pFVar23->_IO_read_end + 6);
      unaff_R15 = (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8);
      unaff_RBP = (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8);
LAB_001101c6:
      plVar40[0xb] = (long)pFVar23;
      pFVar25 = (FILE *)(ulong)uStack_1bc;
    }
    else {
      if (pFVar28 == (FILE *)0x0) {
LAB_001102b8:
        pcStack_1d8 = (code *)0x1102c2;
        anm_defaults_cold_2();
LAB_001102c2:
        pcStack_1d8 = anm_write;
        pcVar43 = pcStack_1c8;
        anm_defaults_cold_4();
        pFStack_200 = pFVar25;
        pFStack_1f8 = pFVar28;
        plStack_1f0 = plVar40;
        lStack_1e8 = (long)plVar37;
        uStack_1e0 = unaff_R15;
        pcStack_1d8 = (code *)unaff_RBP;
        pFVar25 = fopen(pcVar42,"wb");
        if (pFVar25 == (FILE *)0x0) {
          anm_write_cold_1();
          uVar1 = *(ushort *)((long)&((FILE *)pcVar42)->_IO_read_ptr + 2);
          uVar2 = *(ushort *)((long)&((FILE *)pcVar42)->_IO_read_ptr + 4);
          uVar4 = *(ushort *)((long)&((FILE *)pcVar42)->_IO_read_ptr + 6);
          iVar24 = ((FILE *)pcVar42)->_flags;
          uVar8 = *(undefined4 *)&((FILE *)pcVar42)->_IO_read_end;
          uVar5 = *(ushort *)((long)&((FILE *)pcVar42)->_IO_read_end + 4);
          uVar6 = *(ushort *)((long)&((FILE *)pcVar42)->_IO_read_end + 6);
          uVar9 = *(undefined4 *)&((FILE *)pcVar42)->_IO_read_base;
          pcVar43 = *(char **)((long)&((FILE *)pcVar42)->_IO_read_base + 4);
          pcVar13 = *(char **)((long)&((FILE *)pcVar42)->_IO_write_base + 4);
          ((FILE *)pcVar42)->_flags = (uint)*(ushort *)&((FILE *)pcVar42)->field_0x4;
          *(uint *)&((FILE *)pcVar42)->field_0x4 = (uint)*(ushort *)&((FILE *)pcVar42)->field_0x6;
          *(undefined4 *)&((FILE *)pcVar42)->_IO_read_ptr = 0;
          *(uint *)((long)&((FILE *)pcVar42)->_IO_read_ptr + 4) = (uint)uVar1;
          *(uint *)&((FILE *)pcVar42)->_IO_read_end = (uint)uVar2;
          *(uint *)((long)&((FILE *)pcVar42)->_IO_read_end + 4) = (uint)uVar4;
          *(undefined4 *)&((FILE *)pcVar42)->_IO_read_base = 0;
          *(undefined4 *)((long)&((FILE *)pcVar42)->_IO_read_base + 4) = uVar8;
          *(uint *)&((FILE *)pcVar42)->_IO_write_base = (uint)uVar5;
          *(uint *)((long)&((FILE *)pcVar42)->_IO_write_base + 4) = (uint)uVar6;
          *(int *)&((FILE *)pcVar42)->_IO_write_ptr = iVar24;
          *(undefined4 *)((long)&((FILE *)pcVar42)->_IO_write_ptr + 4) = uVar9;
          ((FILE *)pcVar42)->_IO_write_end = pcVar43;
          ((FILE *)pcVar42)->_IO_buf_base = pcVar13;
          return (anm_archive_t *)0x0;
        }
        plVar37 = (long *)(pcVar43 + 0x20);
        sVar48 = 0x14;
        sStack_228 = sVar48;
        if (extraout_EDX == 0x13) {
          sVar48 = 0x28;
          sStack_228 = sVar48;
        }
        do {
          plVar37 = (long *)*plVar37;
          if (plVar37 == (long *)0x0) {
            iVar24 = fclose(pFVar25);
            return (anm_archive_t *)CONCAT44(extraout_var,iVar24);
          }
          plVar11 = (long *)plVar37[2];
          lStack_248 = file_tell((FILE *)pFVar25);
          fflush(pFVar25);
          sVar31 = strlen((char *)plVar11[2]);
          lVar33 = lStack_248;
          plVar40 = plVar11 + 7;
          uStack_22c = 1;
          uVar45 = 0;
          plVar34 = plVar40;
          do {
            uStack_208 = (ulong)uVar45;
            plVar34 = (long *)*plVar34;
            uStack_22c = uStack_22c - 1;
            uVar45 = uVar45 + 1;
          } while (plVar34 != (long *)0x0);
          plStack_220 = plVar11 + 9;
          uStack_230 = 0xffffffff;
          plVar34 = plStack_220;
          do {
            plVar34 = (long *)*plVar34;
            uStack_230 = uStack_230 + 1;
          } while (plVar34 != (long *)0x0);
          uStack_238 = CONCAT44(uStack_238._4_4_,-uStack_22c);
          plStack_218 = plVar37;
          file_seek((FILE *)pFVar25,
                    lStack_248 + (ulong)-uStack_22c * 4 + (ulong)uStack_230 * 8 + 0x40);
          lVar46 = file_tell((FILE *)pFVar25);
          *(int *)(*plVar11 + 0x1c) = (int)lVar46 - (int)lVar33;
          pcVar42 = (char *)plVar11[2];
          sVar32 = strlen(pcVar42);
          file_write((FILE *)pFVar25,pcVar42,sVar32);
          file_write((FILE *)pFVar25,"",0x10 - (ulong)((uint)sVar31 & 0xf));
          if (((char *)plVar11[3] != (char *)0x0) && (*(int *)(*plVar11 + 0x28) == 0)) {
            sVar31 = strlen((char *)plVar11[3]);
            lVar33 = file_tell((FILE *)pFVar25);
            *(int *)(*plVar11 + 0x24) = (int)lVar33 - (int)lStack_248;
            pcVar42 = (char *)plVar11[3];
            sVar32 = strlen(pcVar42);
            file_write((FILE *)pFVar25,pcVar42,sVar32);
            file_write((FILE *)pFVar25,"",0x10 - (ulong)((uint)sVar31 & 0xf));
          }
          lVar33 = file_tell((FILE *)pFVar25);
          plVar37 = plStack_220;
          uVar29 = lVar33 - lStack_248;
          while (plVar40 = (long *)*plVar40, plVar40 != (long *)0x0) {
            file_write((FILE *)pFVar25,(void *)plVar40[2],sVar48);
          }
          lVar33 = lStack_248;
          uStack_210 = uVar29;
          while( true ) {
            plVar37 = (long *)*plVar37;
            if (plVar37 == (long *)0x0) {
              lStack_240 = 0;
            }
            else {
              lStack_240 = plVar37[2];
            }
            iVar24 = (int)lVar33;
            if (plVar37 == (long *)0x0) break;
            lVar33 = file_tell((FILE *)pFVar25);
            *(int *)(*(long *)(lStack_240 + 8) + 4) = (int)lVar33 - iVar24;
            plVar40 = (long *)(lStack_240 + 0x20);
LAB_001104f9:
            lVar33 = lStack_248;
            uVar29 = uStack_250;
            plVar40 = (long *)*plVar40;
            if (plVar40 != (long *)0x0) {
              buffer_00 = (short *)plVar40[2];
              if (*(int *)(*plVar11 + 0x28) == 0) goto LAB_00110530;
              if (*buffer_00 == -1) {
                buffer_00[1] = 0;
                sVar48 = 8;
              }
              else {
                sVar3 = buffer_00[1];
                buffer_00[1] = sVar3 + 8U;
                sVar48 = (size_t)(ushort)(sVar3 + 8U);
              }
              goto LAB_00110571;
            }
            if (*(int *)(lStack_240 + 0x50) == 0) {
              if (*(int *)(*plVar11 + 0x28) == 0) {
                uStack_250 = uStack_250 & 0xffffffff00000000;
                sVar48 = 4;
              }
              else {
                uStack_250 = 0xffff;
                sVar48 = 8;
              }
              file_write((FILE *)pFVar25,&uStack_250,sVar48);
            }
          }
          if (*(short *)(*plVar11 + 0x34) != 0) {
            lVar46 = file_tell((FILE *)pFVar25);
            *(int *)(*plVar11 + 0x30) = (int)lVar46 - iVar24;
            file_write((FILE *)pFVar25,(void *)plVar11[1],0x10);
            file_write((FILE *)pFVar25,(void *)plVar11[0xb],(ulong)*(uint *)(plVar11[1] + 0xc));
          }
          if (*plStack_218 == 0) {
            iVar24 = 0;
          }
          else {
            lVar46 = file_tell((FILE *)pFVar25);
            iVar24 = (int)lVar46 - iVar24;
          }
          puVar12 = (undefined4 *)*plVar11;
          puVar12[0xe] = iVar24;
          *puVar12 = (undefined4)uStack_238;
          puVar12[1] = uStack_230;
          file_seek((FILE *)pFVar25,lVar33);
          buffer = (uint *)*plVar11;
          uVar45 = buffer[10];
          if (uVar45 < 7) {
            file_write((FILE *)pFVar25,buffer,0x40);
            lVar33 = lStack_248;
            sVar15 = sStack_228;
            plVar37 = plStack_220;
            uVar29 = uStack_210;
            uVar16 = uStack_208;
            uVar45 = uStack_22c;
          }
          else {
            uVar17 = buffer[1];
            uVar18 = buffer[3];
            uVar19 = buffer[4];
            uVar20 = buffer[5];
            uVar35 = buffer[7];
            uVar21 = buffer[8];
            uVar22 = buffer[9];
            uStack_238 = *(undefined8 *)(buffer + 0xb);
            uVar7 = buffer[0xd];
            lStack_240 = *(long *)(buffer + 0xe);
            buffer[0] = 0;
            buffer[1] = 0;
            buffer[2] = 0;
            buffer[3] = 0;
            buffer[4] = 0;
            buffer[5] = 0;
            buffer[6] = 0;
            buffer[7] = 0;
            buffer[8] = 0;
            buffer[9] = 0;
            buffer[10] = 0;
            buffer[0xb] = 0;
            buffer[0xc] = 0;
            buffer[0xd] = 0;
            buffer[0xe] = 0;
            buffer[0xf] = 0;
            *(short *)(buffer + 1) = (short)*buffer;
            *(short *)((long)buffer + 6) = (short)uVar17;
            *(undefined2 *)(buffer + 2) = 0;
            *(short *)((long)buffer + 10) = (short)uVar18;
            *(short *)(buffer + 3) = (short)uVar19;
            *(short *)((long)buffer + 0xe) = (short)uVar20;
            buffer[4] = uVar35;
            *(short *)(buffer + 5) = (short)uVar21;
            *(short *)((long)buffer + 0x16) = (short)uVar22;
            *buffer = uVar45;
            *(undefined8 *)(buffer + 6) = uStack_238;
            buffer[8] = uVar7;
            *(long *)(buffer + 9) = lStack_240;
            file_write((FILE *)pFVar25,(void *)*plVar11,0x40);
            convert_header_to_old((anm_header06_t *)*plVar11);
            lVar33 = lStack_248;
            sVar15 = sStack_228;
            plVar37 = plStack_220;
            uVar29 = uStack_210;
            uVar16 = uStack_208;
            uVar45 = uStack_22c;
          }
          while (sVar48 = sStack_228, lStack_248 = lVar33, sStack_228 = sVar15,
                plStack_220 = plVar37, uVar45 != 0) {
            uStack_250._4_4_ = (undefined4)(uStack_250 >> 0x20);
            uStack_250 = CONCAT44(uStack_250._4_4_,(int)uVar29);
            file_write((FILE *)pFVar25,&uStack_250,4);
            uVar45 = (int)uVar16 - 1;
            lVar33 = lStack_248;
            sVar15 = sStack_228;
            plVar37 = plStack_220;
            uVar29 = (ulong)(uint)((int)uVar29 + (int)sVar48);
            uVar16 = (ulong)uVar45;
            sStack_228 = sVar48;
          }
          while (plVar37 = (long *)*plVar37, plVar37 != (long *)0x0) {
            file_write((FILE *)pFVar25,*(void **)(plVar37[2] + 8),8);
          }
          file_seek((FILE *)pFVar25,lVar33 + (ulong)*(uint *)(*plVar11 + 0x38));
          plVar37 = plStack_218;
        } while( true );
      }
      pcVar42 = (char *)0x1c;
      pcStack_1d8 = (code *)0x110155;
      sVar31 = fread(&lStack_1a0,0x1c,1,pFVar28);
      if (((sVar31 != 1) || (lStack_1a0 != 0xa1a0a0d474e5089)) || (iStack_194 != 0x52444849))
      goto LAB_001102ae;
      pcStack_1d8 = (code *)0x11018a;
      fclose(pFVar28);
      unaff_R15 = (ulong)(ushort)(uStack_18e << 8 | uStack_18e >> 8);
      unaff_RBP = (ulong)(ushort)(uStack_18a << 8 | uStack_18a >> 8);
    }
    paVar26 = (anm_archive_t *)*plVar40;
    if (*(int *)((long)&paVar26->map_size + 4) == 0xffff) {
      uVar45 = 1;
      do {
        uVar35 = uVar45;
        uVar45 = uVar35 * 2;
      } while (uVar35 < (uint)unaff_R15);
      *(uint *)((long)&paVar26->map_size + 4) = uVar35;
    }
    if (*(int *)&(paVar26->names).head == 0xffff) {
      uVar45 = 1;
      do {
        uVar35 = uVar45;
        uVar45 = uVar35 * 2;
      } while (uVar35 < (uint)unaff_RBP);
      *(uint *)&(paVar26->names).head = uVar35;
    }
    if (*(short *)((long)&paVar26[1].map + 4) == 1) {
      lVar33 = plVar40[1];
      if (*(short *)(lVar33 + 6) == -1) {
        uVar1 = *(ushort *)((long)&(paVar26->names).head + 4);
        paVar26 = (anm_archive_t *)(ulong)uVar1;
        *(ushort *)(lVar33 + 6) = uVar1;
      }
      if (*(short *)(lVar33 + 8) == -1) {
        *(short *)(lVar33 + 8) = (short)unaff_R15;
      }
      if (*(short *)(lVar33 + 10) == -1) {
        *(short *)(lVar33 + 10) = (short)unaff_RBP;
      }
      if (*(int *)(lVar33 + 0xc) == 0xffff) {
        uVar1 = *(ushort *)(lVar33 + 8);
        uVar2 = *(ushort *)(lVar33 + 10);
        pcStack_1d8 = (code *)0x110260;
        uVar45 = format_Bpp((uint)*(ushort *)(lVar33 + 6));
        uVar45 = uVar45 * (uint)uVar2 * (uint)uVar1;
        paVar26 = (anm_archive_t *)(ulong)uVar45;
        *(uint *)(plVar40[1] + 0xc) = uVar45;
      }
    }
  } while( true );
LAB_00110530:
  uStack_250._4_4_ = SUB84(uVar29,4);
  uStack_250._0_4_ = CONCAT13((char)buffer_00[1],CONCAT12((char)*buffer_00,buffer_00[2]));
  file_write((FILE *)pFVar25,&uStack_250,4);
  sVar48 = uStack_250 >> 0x18 & 0xff;
  if (sVar48 != 0) {
    buffer_00 = buffer_00 + 4;
LAB_00110571:
    file_write((FILE *)pFVar25,buffer_00,sVar48);
  }
  goto LAB_001104f9;
}

Assistant:

static anm_archive_t*
anm_create(
    char* spec,
    FILE* symbolfp,
    unsigned version
) {
    FILE* in = fopen(spec, "r");
    if (!in) {
        fprintf(stderr, "%s: couldn't open %s for reading: %s\n",
            argv0, spec, strerror(errno));
        exit(1);
    }
    if (anm_is_old_format(in)) {
        fprintf(stderr, "%s: %s: the spec file was made using an old version\n"
                        "of thanm and uses the old format, which is no longer supported.\n"
                        "Please use the old version of thanm to create the ANM file, and\n"
                        "re-dump it using this version.\n", argv0, spec);
        return NULL;
    }

    parser_state_t state;
    state.was_error = 0;
    state.time = 0;
    state.default_version = -1;
    state.current_version = -1;
    state.sprite_id = 0;
    state.script_id = 0;
    state.script_real_index = 0;
    list_init(&state.entries);
    list_init(&state.globals);
    list_init(&state.script_names);
    list_init(&state.sprite_names);
    state.current_entry = NULL;
    state.current_script = NULL;
    state.symbolfp = symbolfp;
    strcpy(state.symbol_prefix, "");
    state.version = version;

    path_init(&state.path_state, spec, argv0);

    thanm_yyin = in;
    if (thanm_yyparse(&state) || state.was_error)
        return NULL;

    path_free(&state.path_state);

    anm_archive_t* anm = (anm_archive_t*)util_malloc(sizeof(anm_archive_t));
    anm->map = NULL;
    anm->map_size = 0;
    list_init(&anm->names);
    anm->entries = state.entries;

    anm_entry_t* entry;
    list_for_each(&anm->entries, entry) {
        char* name;
        int found = 0;
        list_for_each(&anm->names, name) {
            if (strcmp(entry->name, name) == 0) {
                free(entry->name);
                entry->name = name;
                found = 1;
                break;
            }
        }
        if (!found)
            list_append_new(&anm->names, entry->name);

        anm_script_t* script;
        list_for_each(&entry->scripts, script) {
            anm_serialize_script(&state, script);

            /* Free vars. */
            var_t* var;
            list_for_each(&script->vars, var) {
                var_free(var);
            }
            list_free_nodes(&script->vars);
        }
    }

    /* Free stuff. */
    reg_free_user();

    symbol_id_pair_t* symbol;
    list_for_each(&state.sprite_names, symbol) {
        free(symbol->name);
        free(symbol);
    }
    list_free_nodes(&state.sprite_names);

    list_for_each(&state.script_names, symbol) {
        free(symbol->name);
        free(symbol);
    }
    list_free_nodes(&state.script_names);

    global_t* global;
    list_for_each(&state.globals, global) {
        free(global->name);
        thanm_param_free(global->param);
    }
    list_free_nodes(&state.globals);

    return anm;
}